

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

SynBase * ParseComplexTerminal(ParseContext *ctx)

{
  uint uVar1;
  Lexeme *begin;
  int iVar2;
  SynBase *pSVar3;
  undefined4 extraout_var;
  SynBase *this;
  undefined4 extraout_var_01;
  Lexeme *pLVar4;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  _func_int **pp_Var5;
  undefined4 extraout_var_00;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_oparen) {
    ctx->currentLexeme = begin + 1;
    if (0xff < ctx->expressionGroupDepth) {
      anon_unknown.dwarf_169315::Stop(ctx,begin + 1,"ERROR: reached nested \'(\' limit of %d",0x100)
      ;
    }
    ctx->expressionGroupDepth = ctx->expressionGroupDepth + 1;
    pSVar3 = ParseAssignment(ctx);
    ctx->expressionGroupDepth = ctx->expressionGroupDepth - 1;
    if (pSVar3 == (SynBase *)0x0) {
      anon_unknown.dwarf_169315::Report
                (ctx,ctx->currentLexeme,"ERROR: expression not found after \'(\'");
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])();
      pSVar3 = (SynBase *)CONCAT44(extraout_var_01,iVar2);
      SynBase::SynBase(pSVar3,0,ctx->currentLexeme,ctx->currentLexeme);
      pSVar3->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e6d30;
    }
    anon_unknown.dwarf_169315::CheckConsume
              (ctx,lex_cparen,"ERROR: closing \')\' not found after \'(\'");
  }
  else {
    if (begin->type == lex_mul) {
      ctx->currentLexeme = begin + 1;
      pSVar3 = ParseTerminal(ctx);
      if (pSVar3 == (SynBase *)0x0) {
        anon_unknown.dwarf_169315::Report
                  (ctx,ctx->currentLexeme,"ERROR: expression not found after \'*\'");
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])();
        pSVar3 = (SynBase *)CONCAT44(extraout_var,iVar2);
        SynBase::SynBase(pSVar3,0,ctx->currentLexeme,ctx->currentLexeme);
        pSVar3->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e6d30;
      }
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
      this = (SynBase *)CONCAT44(extraout_var_00,iVar2);
      if (ctx->firstLexeme < ctx->currentLexeme) {
        SynBase::SynBase(this,0x1e,begin,ctx->currentLexeme + -1);
        this->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e7960;
        this[1]._vptr_SynBase = (_func_int **)pSVar3;
        return this;
      }
LAB_0021720a:
      __assert_fail("currentLexeme > firstLexeme",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                    ,0x19c,"Lexeme *ParseContext::Previous()");
    }
    pSVar3 = ParseString(ctx);
    if (((pSVar3 == (SynBase *)0x0) && (pSVar3 = ParseArray(ctx), pSVar3 == (SynBase *)0x0)) &&
       (pSVar3 = ParseType(ctx,(bool *)0x0,false), pSVar3 == (SynBase *)0x0)) {
      pLVar4 = ctx->currentLexeme;
      if (pLVar4->type == lex_at) {
        ctx->currentLexeme = pLVar4 + 1;
        if (0x22 < pLVar4[1].type - lex_add) {
          anon_unknown.dwarf_169315::Report(ctx,pLVar4 + 1,"ERROR: name expected after \'@\'");
          iVar2 = (*ctx->allocator->_vptr_Allocator[2])();
          pSVar3 = (SynBase *)CONCAT44(extraout_var_03,iVar2);
          SynBase::SynBase(pSVar3,0,ctx->currentLexeme,ctx->currentLexeme);
          pSVar3->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e6d30;
          return pSVar3;
        }
        pp_Var5 = (_func_int **)pLVar4[1].pos;
        uVar1 = pLVar4[1].length;
        pLVar4 = pLVar4 + 2;
      }
      else {
        if (pLVar4->type != lex_string) {
          return (SynBase *)0x0;
        }
        pp_Var5 = (_func_int **)pLVar4->pos;
        uVar1 = pLVar4->length;
        pLVar4 = pLVar4 + 1;
      }
      ctx->currentLexeme = pLVar4;
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      pSVar3 = (SynBase *)CONCAT44(extraout_var_02,iVar2);
      if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_0021720a;
      SynBase::SynBase(pSVar3,4,begin,ctx->currentLexeme + -1);
      pSVar3->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e6190;
      pSVar3[1]._vptr_SynBase = pp_Var5;
      *(ulong *)&pSVar3[1].typeID = (long)pp_Var5 + (ulong)uVar1;
    }
  }
  pSVar3 = ParsePostExpressions(ctx,pSVar3);
  return pSVar3;
}

Assistant:

SynBase* ParseComplexTerminal(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_mul))
	{
		SynBase *node = ParseTerminal(ctx);

		if(!node)
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after '*'");

			node = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		return new (ctx.get<SynDereference>()) SynDereference(start, ctx.Previous(), node);
	}

	SynBase *node = NULL;

	if(ctx.Consume(lex_oparen))
	{
		const unsigned groupLimit = 256;

		if(ctx.expressionGroupDepth >= groupLimit)
			Stop(ctx, ctx.Current(), "ERROR: reached nested '(' limit of %d", groupLimit);

		ctx.expressionGroupDepth++;

		node = ParseAssignment(ctx);

		ctx.expressionGroupDepth--;

		if(!node)
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after '('");

			node = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		CheckConsume(ctx, lex_cparen, "ERROR: closing ')' not found after '('");
	}

	if(!node)
		node = ParseString(ctx);

	if(!node)
		node = ParseArray(ctx);

	if(!node)
		node = ParseType(ctx);

	if(!node && ctx.At(lex_string))
	{
		InplaceStr value = ctx.Consume();

		node = new (ctx.get<SynIdentifier>()) SynIdentifier(start, ctx.Previous(), value);
	}

	if(!node && ctx.Consume(lex_at))
	{
		bool isOperator = (ctx.Peek() >= lex_add && ctx.Peek() <= lex_in) || (ctx.Peek() >= lex_set && ctx.Peek() <= lex_xorset) || ctx.Peek() == lex_bitnot || ctx.Peek() == lex_lognot;

		if(!isOperator)
		{
			Report(ctx, ctx.Current(), "ERROR: name expected after '@'");

			return new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		InplaceStr value = ctx.Consume();

		node = new (ctx.get<SynIdentifier>()) SynIdentifier(start, ctx.Previous(), value);
	}

	if(!node)
		return NULL;
		
	return ParsePostExpressions(ctx, node);
}